

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O0

void __thiscall QTabWidget::paintEvent(QTabWidget *this,QPaintEvent *param_2)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QTabWidgetPrivate *pQVar4;
  QWidget *pQVar5;
  long *in_RDI;
  long in_FS_OFFSET;
  QWidget *w_1;
  QWidget *w;
  QTabWidgetPrivate *d;
  QStylePainter p;
  QStylePainter p_1;
  QStyleOptionTabWidgetFrame opt;
  QStyleOptionTabBarBase opt_2;
  QStyleOptionTabBarBase opt_1;
  QWidget *in_stack_fffffffffffffdd8;
  PrimitiveElement PVar6;
  undefined4 in_stack_fffffffffffffde0;
  Corner in_stack_fffffffffffffde4;
  QWidget *in_stack_fffffffffffffde8;
  int pos;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  QTabBar *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  QSize size;
  undefined1 local_160 [16];
  undefined8 local_150;
  undefined8 local_148;
  undefined1 local_d8 [16];
  undefined1 auStack_c8 [88];
  undefined1 local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QTabWidget *)0x6e86fe);
  bVar1 = documentMode((QTabWidget *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  if (bVar1) {
    bVar1 = QTabBar::drawBase((QTabBar *)
                              CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    if (bVar1) {
      size = (QSize)(in_RDI + 2);
      tabBar((QTabWidget *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      QStylePainter::QStylePainter
                ((QStylePainter *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 (QPaintDevice *)in_stack_fffffffffffffde8,
                 (QWidget *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      pQVar5 = cornerWidget((QTabWidget *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
      if ((pQVar5 != (QWidget *)0x0) && (bVar1 = QWidget::isVisible((QWidget *)0x6e87b5), bVar1)) {
        memset(local_70,0xaa,0x68);
        QStyleOptionTabBarBase::QStyleOptionTabBarBase((QStyleOptionTabBarBase *)0x6e87e2);
        in_stack_fffffffffffffe00 =
             tabBar((QTabWidget *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
        QWidget::size(in_stack_fffffffffffffdd8);
        PVar6 = (PrimitiveElement)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
        QTabBarPrivate::initStyleBaseOption
                  ((QStyleOptionTabBarBase *)
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                   in_stack_fffffffffffffe00,size);
        in_stack_fffffffffffffe0c =
             QWidget::x((QWidget *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
        QRect::x((QRect *)0x6e8847);
        QRect::moveLeft((QRect *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),PVar6
                       );
        QWidget::y((QWidget *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
        QRect::y((QRect *)0x6e8887);
        QRect::moveTop((QRect *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                       (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
        QStylePainter::drawPrimitive
                  ((QStylePainter *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   PVar6,(QStyleOption *)0x6e88b1);
        QStyleOptionTabBarBase::~QStyleOptionTabBarBase((QStyleOptionTabBarBase *)0x6e88be);
      }
      pQVar5 = cornerWidget((QTabWidget *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
      if ((pQVar5 != (QWidget *)0x0) && (bVar1 = QWidget::isVisible((QWidget *)0x6e88e8), bVar1)) {
        memset(local_d8,0xaa,0x68);
        QStyleOptionTabBarBase::QStyleOptionTabBarBase((QStyleOptionTabBarBase *)0x6e8915);
        pQVar5 = &tabBar((QTabWidget *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0)
                        )->super_QWidget;
        QWidget::size(pQVar5);
        PVar6 = (PrimitiveElement)((ulong)pQVar5 >> 0x20);
        QTabBarPrivate::initStyleBaseOption
                  ((QStyleOptionTabBarBase *)
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                   in_stack_fffffffffffffe00,size);
        pos = (int)((ulong)auStack_c8 >> 0x20);
        iVar2 = QWidget::x((QWidget *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0))
        ;
        QRect::x((QRect *)0x6e8978);
        QRect::moveLeft((QRect *)CONCAT44(iVar2,in_stack_fffffffffffffde0),PVar6);
        iVar3 = QWidget::y((QWidget *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0))
        ;
        QRect::y((QRect *)0x6e89b8);
        QRect::moveTop((QRect *)CONCAT44(iVar3,in_stack_fffffffffffffdf0),pos);
        QStylePainter::drawPrimitive
                  ((QStylePainter *)CONCAT44(iVar2,in_stack_fffffffffffffde0),PVar6,
                   (QStyleOption *)0x6e89e2);
        QStyleOptionTabBarBase::~QStyleOptionTabBarBase((QStyleOptionTabBarBase *)0x6e89ef);
      }
      QStylePainter::~QStylePainter((QStylePainter *)0x6e89fc);
    }
  }
  else {
    QStylePainter::QStylePainter
              ((QStylePainter *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8);
    PVar6 = (PrimitiveElement)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
    memset(local_160,0xaa,0x88);
    QStyleOptionTabWidgetFrame::QStyleOptionTabWidgetFrame((QStyleOptionTabWidgetFrame *)0x6e8a64);
    (**(code **)(*in_RDI + 0x1b0))(in_RDI,local_160);
    local_150._0_4_ = (pQVar4->panelRect).x1;
    local_150._4_4_ = (pQVar4->panelRect).y1;
    local_148._0_4_ = (pQVar4->panelRect).x2;
    local_148._4_4_ = (pQVar4->panelRect).y2;
    QStylePainter::drawPrimitive
              ((QStylePainter *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),PVar6,
               (QStyleOption *)0x6e8aba);
    QStyleOptionTabWidgetFrame::~QStyleOptionTabWidgetFrame((QStyleOptionTabWidgetFrame *)0x6e8ac7);
    QStylePainter::~QStylePainter((QStylePainter *)0x6e8ad4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTabWidget::paintEvent(QPaintEvent *)
{
    Q_D(QTabWidget);
    if (documentMode()) {
        if (d->tabs->drawBase()) {
            QStylePainter p(this, tabBar());
            if (QWidget *w = cornerWidget(Qt::TopLeftCorner); w && w->isVisible()) {
                QStyleOptionTabBarBase opt;
                QTabBarPrivate::initStyleBaseOption(&opt, tabBar(), w->size());
                opt.rect.moveLeft(w->x() + opt.rect.x());
                opt.rect.moveTop(w->y() + opt.rect.y());
                p.drawPrimitive(QStyle::PE_FrameTabBarBase, opt);
            }
            if (QWidget *w = cornerWidget(Qt::TopRightCorner); w && w->isVisible()) {
                QStyleOptionTabBarBase opt;
                QTabBarPrivate::initStyleBaseOption(&opt, tabBar(), w->size());
                opt.rect.moveLeft(w->x() + opt.rect.x());
                opt.rect.moveTop(w->y() + opt.rect.y());
                p.drawPrimitive(QStyle::PE_FrameTabBarBase, opt);
            }
        }
        return;
    }
    QStylePainter p(this);

    QStyleOptionTabWidgetFrame opt;
    initStyleOption(&opt);
    opt.rect = d->panelRect;
    p.drawPrimitive(QStyle::PE_FrameTabWidget, opt);
}